

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O1

Result __thiscall wabt::TypeChecker::OnBrIf(TypeChecker *this,Index depth)

{
  pointer pTVar1;
  Result RVar2;
  Result RVar3;
  Label *in_RAX;
  TypeVector *pTVar4;
  Enum EVar5;
  pointer pTVar6;
  Label *label;
  Label *local_38;
  
  local_38 = in_RAX;
  RVar2 = PopAndCheck1Type(this,(Type)0xffffffff,"br_if");
  RVar3 = GetLabel(this,depth,&local_38);
  EVar5 = Error;
  if (RVar3.enum_ != Error) {
    pTVar4 = &local_38->result_types;
    if (local_38->label_type == Loop) {
      pTVar4 = &local_38->param_types;
    }
    RVar3 = PopAndCheckSignature(this,pTVar4,"br_if");
    EVar5 = (Enum)(RVar3.enum_ == Error || RVar2.enum_ == Error);
    pTVar4 = &local_38->result_types;
    if (local_38->label_type == Loop) {
      pTVar4 = &local_38->param_types;
    }
    pTVar1 = (pTVar4->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pTVar6 = (pTVar4->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                  super__Vector_impl_data._M_start; pTVar6 != pTVar1; pTVar6 = pTVar6 + 1) {
      PushType(this,(Type)pTVar6->enum_);
    }
  }
  return (Result)EVar5;
}

Assistant:

Result TypeChecker::OnBrIf(Index depth) {
  Result result = PopAndCheck1Type(Type::I32, "br_if");
  Label* label;
  CHECK_RESULT(GetLabel(depth, &label));
  result |= PopAndCheckSignature(label->br_types(), "br_if");
  PushTypes(label->br_types());
  return result;
}